

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestRunnerFixtureReporterNotifiedOfTestCountHelper::
TestRunnerFixtureReporterNotifiedOfTestCountHelper
          (TestRunnerFixtureReporterNotifiedOfTestCountHelper *this,TestDetails *details)

{
  TestDetails *details_local;
  TestRunnerFixtureReporterNotifiedOfTestCountHelper *this_local;
  
  TestRunnerFixture::TestRunnerFixture(&this->super_TestRunnerFixture);
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfTestCount)
{
    MockTest test1("test", true, false);
    MockTest test2("test", true, false);
    MockTest test3("test", true, false);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
    CHECK_EQUAL(3, reporter.summaryTotalTestCount);
}